

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O3

void lyplg_ext_pfree_instance_substatements(ly_ctx *ctx,lysp_ext_substmt *substmts)

{
  undefined8 *puVar1;
  ushort uVar2;
  ly_stmt lVar3;
  lysp_node *plVar4;
  lysp_ext_substmt *plVar5;
  lysp_ident *ident;
  lysp_import *import;
  lysp_restr *restr;
  lysp_ext_instance *ext;
  lysp_revision *rev;
  lysp_when *when;
  lysp_tpdf *tpdf;
  lysp_feature *feat;
  lysp_refine *ref;
  lysp_include *include;
  void *pvVar6;
  lysp_node *node;
  long lVar7;
  void **ppvVar8;
  lysp_type **type_p;
  void **ppvVar9;
  ulong uVar10;
  lysf_ctx local_60;
  void ***local_40;
  ly_ctx *local_38;
  
  local_60.mod = (lys_module *)0x0;
  local_60.ext_set.size = 0;
  local_60.ext_set.count = 0;
  local_60.ext_set.field_2.dnodes = (lyd_node **)0x0;
  if (substmts != (lysp_ext_substmt *)0x0) {
    local_40 = &substmts[-1].storage_p;
    local_60.ctx = ctx;
    if (substmts[-1].storage_p != (void **)0x0) {
      ppvVar8 = (void **)0x0;
      local_38 = ctx;
LAB_0015e198:
      ppvVar9 = substmts[(long)ppvVar8].storage_p;
      if (ppvVar9 == (void **)0x0) goto LAB_0015ea30;
      plVar5 = substmts + (long)ppvVar8;
      lVar3 = plVar5->stmt;
      if (0x12ffff < (int)lVar3) {
        if ((int)lVar3 < 0x240000) {
          if ((int)lVar3 < 0x1b0000) {
            if ((int)lVar3 < 0x170000) {
              if ((int)lVar3 < 0x150000) {
                if (lVar3 == LY_STMT_IF_FEATURE) {
LAB_0015e5cf:
                  pvVar6 = *ppvVar9;
                  if (pvVar6 != (void *)0x0) {
                    uVar10 = 0xffffffffffffffff;
                    lVar7 = 0;
                    do {
                      uVar10 = uVar10 + 1;
                      if (*(ulong *)((long)pvVar6 + -8) <= uVar10) {
                        pvVar6 = (void *)((long)pvVar6 + -8);
                        goto LAB_0015ea2b;
                      }
                      puVar1 = (undefined8 *)((long)pvVar6 + lVar7);
                      lVar7 = lVar7 + 0x18;
                      lydict_remove(ctx,(char *)*puVar1);
                      pvVar6 = *plVar5->storage_p;
                    } while (pvVar6 != (void *)0x0);
                  }
                }
                else {
                  if (lVar3 != LY_STMT_IMPORT) goto LAB_0015e809;
                  pvVar6 = *ppvVar9;
                  if (pvVar6 != (void *)0x0) {
                    uVar10 = 0xffffffffffffffff;
                    lVar7 = 0;
                    do {
                      uVar10 = uVar10 + 1;
                      if (*(ulong *)((long)pvVar6 + -8) <= uVar10) goto LAB_0015ea24;
                      import = (lysp_import *)((long)pvVar6 + lVar7);
                      lVar7 = lVar7 + 0x40;
                      lysp_import_free(&local_60,import);
                      pvVar6 = *plVar5->storage_p;
                    } while (pvVar6 != (void *)0x0);
                  }
                }
              }
              else {
                if (lVar3 != LY_STMT_INCLUDE) {
                  if (lVar3 == LY_STMT_KEY) goto LAB_0015e7dc;
                  goto LAB_0015e809;
                }
                pvVar6 = *ppvVar9;
                if (pvVar6 != (void *)0x0) {
                  uVar10 = 0xffffffffffffffff;
                  lVar7 = 0;
                  do {
                    uVar10 = uVar10 + 1;
                    if (*(ulong *)((long)pvVar6 + -8) <= uVar10) goto LAB_0015ea24;
                    include = (lysp_include *)((long)pvVar6 + lVar7);
                    lVar7 = lVar7 + 0x38;
                    lysp_include_free_(&local_60,include,'\x01');
                    pvVar6 = *plVar5->storage_p;
                  } while (pvVar6 != (void *)0x0);
                }
              }
            }
            else if ((int)lVar3 < 0x190000) {
              if (lVar3 == LY_STMT_LENGTH) goto LAB_0015e6d9;
              if (lVar3 != LY_STMT_MANDATORY) goto LAB_0015e809;
            }
            else if ((lVar3 != LY_STMT_MAX_ELEMENTS) && (lVar3 != LY_STMT_MIN_ELEMENTS))
            goto LAB_0015e809;
          }
          else {
            if ((int)lVar3 < 0x1f0000) {
              if ((int)lVar3 < 0x1d0000) {
                if (lVar3 == LY_STMT_MODIFIER) goto LAB_0015e7dc;
                if (lVar3 == LY_STMT_MODULE) goto LAB_0015e566;
              }
              else {
                if (lVar3 == LY_STMT_MUST) {
LAB_0015e6d9:
                  pvVar6 = *ppvVar9;
                  if (pvVar6 != (void *)0x0) {
                    uVar10 = 0xffffffffffffffff;
                    lVar7 = 0;
                    do {
                      uVar10 = uVar10 + 1;
                      if (*(ulong *)((long)pvVar6 + -8) <= uVar10) goto LAB_0015ea24;
                      restr = (lysp_restr *)((long)pvVar6 + lVar7);
                      lVar7 = lVar7 + 0x40;
                      lysp_restr_free(&local_60,restr);
                      pvVar6 = *plVar5->storage_p;
                    } while (pvVar6 != (void *)0x0);
                  }
                  goto LAB_0015ea30;
                }
                if (lVar3 == LY_STMT_NAMESPACE) goto LAB_0015e7dc;
              }
              goto LAB_0015e809;
            }
            if ((int)lVar3 < 0x210000) {
              if (lVar3 != LY_STMT_ORDERED_BY) {
                if (lVar3 == LY_STMT_ORGANIZATION) goto LAB_0015e7dc;
                goto LAB_0015e809;
              }
            }
            else if (lVar3 == LY_STMT_PATH) {
              lyxp_expr_free(ctx,(lyxp_expr *)*ppvVar9);
            }
            else {
              if (lVar3 == LY_STMT_PATTERN) goto LAB_0015e6d9;
              if (lVar3 != LY_STMT_POSITION) goto LAB_0015e809;
            }
          }
          goto LAB_0015ea30;
        }
        if ((int)lVar3 < 0x2d0000) {
          if ((int)lVar3 < 0x280000) {
            if ((int)lVar3 < 0x260000) {
              if ((lVar3 == LY_STMT_PREFIX) || (lVar3 == LY_STMT_PRESENCE)) goto LAB_0015e7dc;
            }
            else {
              if (lVar3 == LY_STMT_RANGE) goto LAB_0015e6d9;
              if (lVar3 == LY_STMT_REFERENCE) goto LAB_0015e7dc;
            }
            goto LAB_0015e809;
          }
          if ((int)lVar3 < 0x2a0000) {
            if (lVar3 == LY_STMT_REFINE) {
              pvVar6 = *ppvVar9;
              if (pvVar6 != (void *)0x0) {
                uVar10 = 0xffffffffffffffff;
                lVar7 = 0;
                do {
                  uVar10 = uVar10 + 1;
                  if (*(ulong *)((long)pvVar6 + -8) <= uVar10) goto LAB_0015ea24;
                  ref = (lysp_refine *)((long)pvVar6 + lVar7);
                  lVar7 = lVar7 + 0x50;
                  lysp_refine_free(&local_60,ref);
                  pvVar6 = *plVar5->storage_p;
                } while (pvVar6 != (void *)0x0);
              }
            }
            else if (lVar3 != LY_STMT_REQUIRE_INSTANCE) goto LAB_0015e809;
          }
          else if (lVar3 == LY_STMT_REVISION) {
            pvVar6 = *ppvVar9;
            if (pvVar6 != (void *)0x0) {
              uVar10 = 0xffffffffffffffff;
              lVar7 = 0;
              do {
                uVar10 = uVar10 + 1;
                if (*(ulong *)((long)pvVar6 + -8) <= uVar10) goto LAB_0015ea24;
                rev = (lysp_revision *)((long)pvVar6 + lVar7);
                lVar7 = lVar7 + 0x28;
                lysp_revision_free(&local_60,rev);
                pvVar6 = *plVar5->storage_p;
              } while (pvVar6 != (void *)0x0);
            }
          }
          else {
            if (lVar3 == LY_STMT_REVISION_DATE) goto LAB_0015e7dc;
            if (lVar3 != LY_STMT_STATUS) goto LAB_0015e809;
          }
          goto LAB_0015ea30;
        }
        if (0x30ffff < (int)lVar3) {
          if ((int)lVar3 < 0x330000) {
            if (lVar3 == LY_STMT_UNITS) goto LAB_0015e7dc;
            if (lVar3 != LY_STMT_VALUE) goto LAB_0015e809;
          }
          else if (lVar3 == LY_STMT_WHEN) {
            pvVar6 = *ppvVar9;
            if (pvVar6 != (void *)0x0) {
              uVar10 = 0xffffffffffffffff;
              lVar7 = 0;
              do {
                uVar10 = uVar10 + 1;
                if (*(ulong *)((long)pvVar6 + -8) <= uVar10) goto LAB_0015ea24;
                when = (lysp_when *)((long)pvVar6 + lVar7);
                lVar7 = lVar7 + 0x20;
                lysp_when_free(&local_60,when);
                pvVar6 = *plVar5->storage_p;
              } while (pvVar6 != (void *)0x0);
            }
          }
          else if ((lVar3 != LY_STMT_YANG_VERSION) && (lVar3 != LY_STMT_YIN_ELEMENT))
          goto LAB_0015e809;
          goto LAB_0015ea30;
        }
        if (0x2effff < (int)lVar3) {
          if (lVar3 != LY_STMT_TYPEDEF) {
            if (lVar3 == LY_STMT_UNIQUE) goto LAB_0015e5cf;
            goto LAB_0015e809;
          }
          pvVar6 = *ppvVar9;
          if (pvVar6 != (void *)0x0) {
            uVar10 = 0xffffffffffffffff;
            lVar7 = 0;
            do {
              uVar10 = uVar10 + 1;
              if (*(ulong *)((long)pvVar6 + -8) <= uVar10) goto LAB_0015ea24;
              tpdf = (lysp_tpdf *)((long)pvVar6 + lVar7);
              lVar7 = lVar7 + 0xb0;
              lysp_tpdf_free(&local_60,tpdf);
              pvVar6 = *plVar5->storage_p;
            } while (pvVar6 != (void *)0x0);
          }
          goto LAB_0015ea30;
        }
        if (lVar3 == LY_STMT_SUBMODULE) {
LAB_0015e566:
          lysp_module_free(&local_60,(lysp_module *)*ppvVar9);
          goto LAB_0015ea30;
        }
        if (lVar3 != LY_STMT_TYPE) goto LAB_0015e809;
        lysp_type_free(&local_60,(lysp_type *)*ppvVar9);
        pvVar6 = *ppvVar9;
        goto LAB_0015ea2b;
      }
      if ((int)lVar3 < 0x20000) {
        if ((int)lVar3 < 0x100) {
          if (((lVar3 - LY_STMT_NOTIFICATION < 0x40) &&
              ((0x800000008000808bU >> ((ulong)(lVar3 - LY_STMT_NOTIFICATION) & 0x3f) & 1) != 0)) ||
             (lVar3 == LY_STMT_AUGMENT)) goto LAB_0015e384;
          goto LAB_0015e809;
        }
        if ((int)lVar3 < 0x1000) {
          if ((int)lVar3 < 0x400) {
            if ((lVar3 == LY_STMT_CASE) || (lVar3 == LY_STMT_CHOICE)) goto LAB_0015e384;
          }
          else if ((lVar3 == LY_STMT_CONTAINER) || (lVar3 == LY_STMT_GROUPING)) goto LAB_0015e384;
        }
        else if ((int)lVar3 < 0x4000) {
          if ((lVar3 == LY_STMT_LEAF) || (lVar3 == LY_STMT_LEAF_LIST)) goto LAB_0015e384;
        }
        else {
          if ((lVar3 == LY_STMT_LIST) || (lVar3 == LY_STMT_USES)) {
LAB_0015e384:
            node = (lysp_node *)*ppvVar9;
            if (node != (lysp_node *)0x0) {
              do {
                plVar4 = node->next;
                uVar2 = node->nodetype;
                lysp_node_free(&local_60,node);
                if ((uVar2 & 0x3000) != 0) {
                  free(node);
                }
                node = plVar4;
              } while (plVar4 != (lysp_node *)0x0);
              ppvVar9 = plVar5->storage_p;
              ctx = local_38;
            }
            *ppvVar9 = (void *)0x0;
            goto LAB_0015ea30;
          }
          if (lVar3 == LY_STMT_ARGUMENT) goto LAB_0015e7dc;
        }
        goto LAB_0015e809;
      }
      if ((int)lVar3 < 0xa0000) {
        if (0x5ffff < (int)lVar3) {
          if ((int)lVar3 < 0x80000) {
            if (lVar3 == LY_STMT_CONTACT) {
LAB_0015e7dc:
              lydict_remove(ctx,(char *)*ppvVar9);
              goto LAB_0015ea30;
            }
            if (lVar3 == LY_STMT_DEFAULT) goto LAB_0015e5cf;
          }
          else {
            if (lVar3 == LY_STMT_DESCRIPTION) goto LAB_0015e7dc;
            if (lVar3 == LY_STMT_DEVIATE) {
              lysp_deviate_free(&local_60,(lysp_deviate *)*ppvVar9);
              goto LAB_0015ea30;
            }
          }
          goto LAB_0015e809;
        }
        if ((int)lVar3 < 0x40000) {
          if (lVar3 != LY_STMT_BASE) {
            if (lVar3 == LY_STMT_BELONGS_TO) goto LAB_0015e7dc;
            goto LAB_0015e809;
          }
          pvVar6 = **ppvVar9;
          if (pvVar6 != (void *)0x0) {
            uVar10 = 0;
            do {
              if (*(ulong *)((long)pvVar6 + -8) <= uVar10) goto LAB_0015ea24;
              lydict_remove(ctx,(char *)((long)pvVar6 + uVar10));
              uVar10 = uVar10 + 1;
              pvVar6 = **plVar5->storage_p;
            } while (pvVar6 != (void *)0x0);
          }
        }
        else if (lVar3 == LY_STMT_BIT) {
LAB_0015e7ec:
          lysp_type_enum_free(&local_60,(lysp_type_enum *)*ppvVar9);
        }
        else if (lVar3 != LY_STMT_CONFIG) goto LAB_0015e809;
      }
      else if ((int)lVar3 < 0xe0000) {
        if ((int)lVar3 < 0xc0000) {
          if (lVar3 == LY_STMT_DEVIATION) {
            lysp_deviation_free(&local_60,(lysp_deviation *)*ppvVar9);
            goto LAB_0015ea30;
          }
          if (lVar3 == LY_STMT_ENUM) goto LAB_0015e7ec;
        }
        else if ((lVar3 == LY_STMT_ERROR_APP_TAG) || (lVar3 == LY_STMT_ERROR_MESSAGE))
        goto LAB_0015e7dc;
LAB_0015e809:
        ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_free.c"
               ,0x602);
      }
      else if ((int)lVar3 < 0x100000) {
        if (lVar3 == LY_STMT_EXTENSION) {
          lysp_ext_free(&local_60,(lysp_ext *)*ppvVar9);
        }
        else {
          if (lVar3 != LY_STMT_EXTENSION_INSTANCE) goto LAB_0015e809;
          pvVar6 = *ppvVar9;
          if (pvVar6 != (void *)0x0) {
            uVar10 = 0xffffffffffffffff;
            lVar7 = 0;
            do {
              uVar10 = uVar10 + 1;
              if (*(ulong *)((long)pvVar6 + -8) <= uVar10) goto LAB_0015ea24;
              ext = (lysp_ext_instance *)((long)pvVar6 + lVar7);
              lVar7 = lVar7 + 0x70;
              lysp_ext_instance_free(&local_60,ext);
              pvVar6 = *plVar5->storage_p;
            } while (pvVar6 != (void *)0x0);
          }
        }
      }
      else if (lVar3 == LY_STMT_FEATURE) {
        pvVar6 = *ppvVar9;
        if (pvVar6 != (void *)0x0) {
          uVar10 = 0xffffffffffffffff;
          lVar7 = 0;
          do {
            uVar10 = uVar10 + 1;
            if (*(ulong *)((long)pvVar6 + -8) <= uVar10) goto LAB_0015ea24;
            feat = (lysp_feature *)((long)pvVar6 + lVar7);
            lVar7 = lVar7 + 0x40;
            lysp_feature_free(&local_60,feat);
            pvVar6 = *plVar5->storage_p;
          } while (pvVar6 != (void *)0x0);
        }
      }
      else if (lVar3 != LY_STMT_FRACTION_DIGITS) {
        if (lVar3 != LY_STMT_IDENTITY) goto LAB_0015e809;
        pvVar6 = *ppvVar9;
        if (pvVar6 != (void *)0x0) {
          uVar10 = 0xffffffffffffffff;
          lVar7 = 0;
          do {
            uVar10 = uVar10 + 1;
            if (*(ulong *)((long)pvVar6 + -8) <= uVar10) goto LAB_0015ea24;
            ident = (lysp_ident *)((long)pvVar6 + lVar7);
            lVar7 = lVar7 + 0x38;
            lysp_ident_free(&local_60,ident);
            pvVar6 = *plVar5->storage_p;
          } while (pvVar6 != (void *)0x0);
        }
      }
      goto LAB_0015ea30;
    }
LAB_0015ea58:
    free(local_40);
  }
  return;
LAB_0015ea24:
  pvVar6 = (void *)((long)pvVar6 + -8);
LAB_0015ea2b:
  free(pvVar6);
LAB_0015ea30:
  ppvVar8 = (void **)((long)ppvVar8 + 1);
  if (*local_40 <= ppvVar8) goto LAB_0015ea58;
  goto LAB_0015e198;
}

Assistant:

LIBYANG_API_DEF void
lyplg_ext_pfree_instance_substatements(const struct ly_ctx *ctx, struct lysp_ext_substmt *substmts)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysf_ctx fctx = {.ctx = (struct ly_ctx *)ctx};
    ly_bool node_free;

    LY_ARRAY_FOR(substmts, u) {
        if (!substmts[u].storage_p) {
            continue;
        }

        switch (substmts[u].stmt) {
        case LY_STMT_NOTIFICATION:
        case LY_STMT_INPUT:
        case LY_STMT_OUTPUT:
        case LY_STMT_ACTION:
        case LY_STMT_RPC:
        case LY_STMT_ANYDATA:
        case LY_STMT_ANYXML:
        case LY_STMT_AUGMENT:
        case LY_STMT_CASE:
        case LY_STMT_CHOICE:
        case LY_STMT_CONTAINER:
        case LY_STMT_GROUPING:
        case LY_STMT_LEAF:
        case LY_STMT_LEAF_LIST:
        case LY_STMT_LIST:
        case LY_STMT_USES: {
            struct lysp_node *child, *child_next;

            LY_LIST_FOR_SAFE(*substmts[u].storage_p, child_next, child) {
                node_free = (child->nodetype & (LYS_INPUT | LYS_OUTPUT)) ? 1 : 0;
                lysp_node_free(&fctx, child);
                if (node_free) {
                    free(child);
                }
            }
            *substmts[u].storage_p = NULL;
            break;
        }
        case LY_STMT_BASE:
            /* multiple strings */
            FREE_ARRAY(ctx, **(const char ***)substmts[u].storage_p, lydict_remove);
            break;

        case LY_STMT_BIT:
        case LY_STMT_ENUM:
            /* single enum */
            lysp_type_enum_free(&fctx, *substmts[u].storage_p);
            break;

        case LY_STMT_DEVIATE:
            /* single deviate */
            lysp_deviate_free(&fctx, *substmts[u].storage_p);
            break;

        case LY_STMT_DEVIATION:
            /* single deviation */
            lysp_deviation_free(&fctx, *substmts[u].storage_p);
            break;

        case LY_STMT_EXTENSION:
            /* single extension */
            lysp_ext_free(&fctx, *substmts[u].storage_p);
            break;

        case LY_STMT_EXTENSION_INSTANCE:
            /* multiple extension instances */
            FREE_ARRAY(&fctx, *(struct lysp_ext_instance **)substmts[u].storage_p, lysp_ext_instance_free);
            break;

        case LY_STMT_FEATURE:
            /* multiple features */
            FREE_ARRAY(&fctx, *(struct lysp_feature **)substmts[u].storage_p, lysp_feature_free);
            break;

        case LY_STMT_IDENTITY:
            /* multiple identities */
            FREE_ARRAY(&fctx, *(struct lysp_ident **)substmts[u].storage_p, lysp_ident_free);
            break;

        case LY_STMT_IMPORT:
            /* multiple imports */
            FREE_ARRAY(&fctx, *(struct lysp_import **)substmts[u].storage_p, lysp_import_free);
            break;

        case LY_STMT_INCLUDE:
            /* multiple includes */
            FREE_ARRAY(&fctx, *(struct lysp_include **)substmts[u].storage_p, lysp_include_free);
            break;

        case LY_STMT_REFINE:
            /* multiple refines */
            FREE_ARRAY(&fctx, *(struct lysp_refine **)substmts[u].storage_p, lysp_refine_free);
            break;

        case LY_STMT_REVISION:
            /* multiple revisions */
            FREE_ARRAY(&fctx, *(struct lysp_revision **)substmts[u].storage_p, lysp_revision_free);
            break;

        case LY_STMT_CONFIG:
        case LY_STMT_FRACTION_DIGITS:
        case LY_STMT_MANDATORY:
        case LY_STMT_MAX_ELEMENTS:
        case LY_STMT_MIN_ELEMENTS:
        case LY_STMT_ORDERED_BY:
        case LY_STMT_POSITION:
        case LY_STMT_REQUIRE_INSTANCE:
        case LY_STMT_STATUS:
        case LY_STMT_VALUE:
        case LY_STMT_YANG_VERSION:
        case LY_STMT_YIN_ELEMENT:
            /* nothing to do */
            break;

        case LY_STMT_ARGUMENT:
        case LY_STMT_BELONGS_TO:
        case LY_STMT_CONTACT:
        case LY_STMT_DESCRIPTION:
        case LY_STMT_ERROR_APP_TAG:
        case LY_STMT_ERROR_MESSAGE:
        case LY_STMT_KEY:
        case LY_STMT_MODIFIER:
        case LY_STMT_NAMESPACE:
        case LY_STMT_ORGANIZATION:
        case LY_STMT_PREFIX:
        case LY_STMT_PRESENCE:
        case LY_STMT_REFERENCE:
        case LY_STMT_REVISION_DATE:
        case LY_STMT_UNITS:
            /* single string */
            lydict_remove(ctx, *substmts[u].storage_p);
            break;

        case LY_STMT_LENGTH:
        case LY_STMT_MUST:
        case LY_STMT_PATTERN:
        case LY_STMT_RANGE:
            /* multiple restrictions */
            FREE_ARRAY(&fctx, *(struct lysp_restr **)substmts[u].storage_p, lysp_restr_free);
            break;

        case LY_STMT_WHEN:
            /* multiple whens */
            FREE_ARRAY(&fctx, *(struct lysp_when **)substmts[u].storage_p, lysp_when_free);
            break;

        case LY_STMT_PATH:
            /* single expression */
            lyxp_expr_free(ctx, *substmts[u].storage_p);
            break;

        case LY_STMT_DEFAULT:
        case LY_STMT_IF_FEATURE:
        case LY_STMT_UNIQUE:
            /* multiple qnames */
            FREE_ARRAY(ctx, *(struct lysp_qname **)substmts[u].storage_p, lysp_qname_free);
            break;

        case LY_STMT_TYPEDEF:
            /* multiple typedefs */
            FREE_ARRAY(&fctx, *(struct lysp_tpdf **)substmts[u].storage_p, lysp_tpdf_free);
            break;

        case LY_STMT_TYPE: {
            /* single type */
            struct lysp_type **type_p = (struct lysp_type **)substmts[u].storage_p;

            lysp_type_free(&fctx, *type_p);
            free(*type_p);
            break;
        }
        case LY_STMT_MODULE:
        case LY_STMT_SUBMODULE:
            /* single (sub)module */
            lysp_module_free(&fctx, *substmts[u].storage_p);
            break;

        default:
            LOGINT(ctx);
        }
    }

    LY_ARRAY_FREE(substmts);
}